

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

int Cba_FonName(Cba_Ntk_t *p,int f)

{
  int iVar1;
  char *__assertion;
  
  if ((p->vFonName).nSize < 1) {
    __assertion = "Cba_NtkHasFonNames(p)";
  }
  else {
    if (0 < f) {
      iVar1 = Vec_IntGetEntry(&p->vFonName,f);
      return iVar1;
    }
    __assertion = "Cba_FonIsReal(f)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x18a,"int Cba_FonName(Cba_Ntk_t *, int)");
}

Assistant:

static inline int            Cba_FonName( Cba_Ntk_t * p, int f )             { assert(Cba_NtkHasFonNames(p)); assert(Cba_FonIsReal(f)); return Vec_IntGetEntry( &p->vFonName, f );                        }